

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::MakeCurrent::MakeCurrent
          (MakeCurrent *this,EGLThread *thread,EGLDisplay display,
          SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *surface,
          SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *context)

{
  bool bVar1;
  SharedPtr<tcu::ThreadUtil::Object> local_80;
  SharedPtr<tcu::ThreadUtil::Object> local_70;
  SharedPtr<tcu::ThreadUtil::Object> local_60;
  SharedPtr<tcu::ThreadUtil::Object> local_50 [2];
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *local_30;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *context_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *surface_local;
  EGLDisplay display_local;
  EGLThread *thread_local;
  MakeCurrent *this_local;
  
  local_30 = context;
  context_local = (SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)surface;
  surface_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)display;
  display_local = thread;
  thread_local = (EGLThread *)this;
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,"MakeCurrent");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__MakeCurrent_03277548;
  this->m_display = surface_local;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr(&this->m_surface,surface);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr(&this->m_context,context);
  bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->m_context);
  if (bVar1) {
    de::SharedPtr<tcu::ThreadUtil::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>
              (local_50,&this->m_context);
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,local_50);
    de::SharedPtr<tcu::ThreadUtil::Object>::~SharedPtr(local_50);
  }
  bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->m_surface);
  if (bVar1) {
    de::SharedPtr<tcu::ThreadUtil::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>
              (&local_60,&this->m_surface);
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_60);
    de::SharedPtr<tcu::ThreadUtil::Object>::~SharedPtr(&local_60);
  }
  bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)((long)display_local + 0x90));
  if (bVar1) {
    de::SharedPtr<tcu::ThreadUtil::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>
              (&local_70,
               (SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)((long)display_local + 0x90));
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_70);
    de::SharedPtr<tcu::ThreadUtil::Object>::~SharedPtr(&local_70);
  }
  bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)((long)display_local + 0xa0));
  if (bVar1) {
    de::SharedPtr<tcu::ThreadUtil::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>
              (&local_80,
               (SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)((long)display_local + 0xa0));
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_80);
    de::SharedPtr<tcu::ThreadUtil::Object>::~SharedPtr(&local_80);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator=
            ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)((long)display_local + 0x90),
             &this->m_context);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator=
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)((long)display_local + 0xa0),
             &this->m_surface);
  return;
}

Assistant:

MakeCurrent::MakeCurrent (EGLThread& thread, EGLDisplay display, SharedPtr<Surface> surface, SharedPtr<GLES2Context> context)
	: tcu::ThreadUtil::Operation	("MakeCurrent")
	, m_display					(display)
	, m_surface					(surface)
	, m_context					(context)
{
	if (m_context)
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(m_context));

	if (m_surface)
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(m_surface));

	// Release old contexts
	if (thread.context)
	{
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(thread.context));
	}

	// Release old surface
	if (thread.surface)
	{
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(thread.surface));
	}

	thread.context	= m_context;
	thread.surface	= m_surface;
}